

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ieee.cc
# Opt level: O3

void TestDouble_NormalizedBoundaries(void)

{
  long lVar1;
  ulong uVar2;
  char *pcVar3;
  uint uVar4;
  undefined8 uVar5;
  ulong uVar6;
  DiyFp DVar7;
  DiyFp boundary_plus;
  DiyFp boundary_minus;
  uint uVar8;
  Double local_58;
  DiyFp local_50;
  DiyFp local_40;
  
  local_50.f_ = 0;
  local_50.e_ = 0;
  local_40.f_ = 0;
  local_40.e_ = 0;
  local_58.d64_ = 0x3ff8000000000000;
  DVar7 = double_conversion::Double::AsNormalizedDiyFp(&local_58);
  uVar4 = DVar7.e_;
  local_58.d64_ = 0x3ff8000000000000;
  double_conversion::Double::NormalizedBoundaries(&local_58,&local_40,&local_50);
  if (uVar4 == local_40.e_) {
    if (uVar4 == local_50.e_) {
      lVar1 = DVar7.f_ - local_40.f_;
      if (lVar1 == local_50.f_ - DVar7.f_) {
        if (lVar1 == 0x400) {
          local_58.d64_ = 0x3ff0000000000000;
          DVar7 = double_conversion::Double::AsNormalizedDiyFp(&local_58);
          uVar4 = DVar7.e_;
          local_58.d64_ = 0x3ff0000000000000;
          double_conversion::Double::NormalizedBoundaries(&local_58,&local_40,&local_50);
          if (uVar4 == local_40.e_) {
            if (uVar4 == local_50.e_) {
              uVar2 = local_50.f_ - DVar7.f_;
              uVar6 = DVar7.f_ - local_40.f_;
              if (uVar6 < uVar2) {
                if (uVar6 == 0x200) {
                  if (uVar2 == 0x400) {
                    local_58.d64_ = 1;
                    DVar7 = double_conversion::Double::AsNormalizedDiyFp(&local_58);
                    uVar4 = DVar7.e_;
                    local_58.d64_ = 1;
                    double_conversion::Double::NormalizedBoundaries(&local_58,&local_40,&local_50);
                    if (uVar4 == local_40.e_) {
                      if (uVar4 == local_50.e_) {
                        lVar1 = DVar7.f_ - local_40.f_;
                        if (lVar1 == local_50.f_ - DVar7.f_) {
                          if (lVar1 == 0x4000000000000000) {
                            local_58.d64_ = 0x10000000000000;
                            DVar7 = double_conversion::Double::AsNormalizedDiyFp(&local_58);
                            uVar4 = DVar7.e_;
                            local_58.d64_ = 0x10000000000000;
                            double_conversion::Double::NormalizedBoundaries
                                      (&local_58,&local_40,&local_50);
                            if (uVar4 == local_40.e_) {
                              if (uVar4 == local_50.e_) {
                                lVar1 = DVar7.f_ - local_40.f_;
                                if (lVar1 == local_50.f_ - DVar7.f_) {
                                  if (lVar1 == 0x400) {
                                    local_58.d64_ = 0xfffffffffffff;
                                    DVar7 = double_conversion::Double::AsNormalizedDiyFp(&local_58);
                                    uVar4 = DVar7.e_;
                                    local_58.d64_ = 0xfffffffffffff;
                                    double_conversion::Double::NormalizedBoundaries
                                              (&local_58,&local_40,&local_50);
                                    if (uVar4 == local_40.e_) {
                                      if (uVar4 == local_50.e_) {
                                        lVar1 = DVar7.f_ - local_40.f_;
                                        if (lVar1 == local_50.f_ - DVar7.f_) {
                                          if (lVar1 == 0x800) {
                                            local_58.d64_ = 0x7fefffffffffffff;
                                            DVar7 = double_conversion::Double::AsNormalizedDiyFp
                                                              (&local_58);
                                            uVar4 = DVar7.e_;
                                            local_58.d64_ = 0x7fefffffffffffff;
                                            double_conversion::Double::NormalizedBoundaries
                                                      (&local_58,&local_40,&local_50);
                                            if (uVar4 == local_40.e_) {
                                              if (uVar4 == local_50.e_) {
                                                lVar1 = DVar7.f_ - local_40.f_;
                                                if (lVar1 == local_50.f_ - DVar7.f_) {
                                                  if (lVar1 == 0x400) {
                                                    return;
                                                  }
                                                  pcVar3 = 
                                                  "(1 << 10) == diy_fp.f() - boundary_minus.f()";
                                                  uVar5 = 0x14d;
                                                }
                                                else {
                                                  pcVar3 = 
                                                  "diy_fp.f() - boundary_minus.f() == boundary_plus.f() - diy_fp.f()"
                                                  ;
                                                  uVar5 = 0x14c;
                                                }
                                                goto LAB_0086aa31;
                                              }
                                              pcVar3 = "boundary_plus.e()";
                                              uVar5 = 0x149;
                                              uVar8 = local_50.e_;
                                            }
                                            else {
                                              pcVar3 = "boundary_minus.e()";
                                              uVar5 = 0x148;
                                              uVar8 = local_40.e_;
                                            }
                                            goto LAB_0086a9ec;
                                          }
                                          pcVar3 = "(1 << 11) == diy_fp.f() - boundary_minus.f()";
                                          uVar5 = 0x143;
                                        }
                                        else {
                                          pcVar3 = 
                                          "diy_fp.f() - boundary_minus.f() == boundary_plus.f() - diy_fp.f()"
                                          ;
                                          uVar5 = 0x142;
                                        }
                                        goto LAB_0086aa31;
                                      }
                                      pcVar3 = "boundary_plus.e()";
                                      uVar5 = 0x141;
                                      uVar8 = local_50.e_;
                                    }
                                    else {
                                      pcVar3 = "boundary_minus.e()";
                                      uVar5 = 0x140;
                                      uVar8 = local_40.e_;
                                    }
                                    goto LAB_0086a9ec;
                                  }
                                  pcVar3 = "(1 << 10) == diy_fp.f() - boundary_minus.f()";
                                  uVar5 = 0x13a;
                                }
                                else {
                                  pcVar3 = 
                                  "diy_fp.f() - boundary_minus.f() == boundary_plus.f() - diy_fp.f()"
                                  ;
                                  uVar5 = 0x139;
                                }
                                goto LAB_0086aa31;
                              }
                              pcVar3 = "boundary_plus.e()";
                              uVar5 = 0x136;
                              uVar8 = local_50.e_;
                            }
                            else {
                              pcVar3 = "boundary_minus.e()";
                              uVar5 = 0x135;
                              uVar8 = local_40.e_;
                            }
                            goto LAB_0086a9ec;
                          }
                          pcVar3 = 
                          "(static_cast<uint64_t>(1) << 62) == diy_fp.f() - boundary_minus.f()";
                          uVar5 = 0x12f;
                        }
                        else {
                          pcVar3 = 
                          "diy_fp.f() - boundary_minus.f() == boundary_plus.f() - diy_fp.f()";
                          uVar5 = 300;
                        }
                        goto LAB_0086aa31;
                      }
                      pcVar3 = "boundary_plus.e()";
                      uVar5 = 0x129;
                      uVar8 = local_50.e_;
                    }
                    else {
                      pcVar3 = "boundary_minus.e()";
                      uVar5 = 0x128;
                      uVar8 = local_40.e_;
                    }
                    goto LAB_0086a9ec;
                  }
                  pcVar3 = "(1 << 10) == boundary_plus.f() - diy_fp.f()";
                  uVar5 = 0x123;
                }
                else {
                  pcVar3 = "(1 << 9) == diy_fp.f() - boundary_minus.f()";
                  uVar5 = 0x122;
                }
              }
              else {
                pcVar3 = "boundary_plus.f() - diy_fp.f() > diy_fp.f() - boundary_minus.f()";
                uVar5 = 0x121;
              }
              goto LAB_0086aa31;
            }
            pcVar3 = "boundary_plus.e()";
            uVar5 = 0x11e;
            uVar8 = local_50.e_;
          }
          else {
            pcVar3 = "boundary_minus.e()";
            uVar5 = 0x11d;
            uVar8 = local_40.e_;
          }
          goto LAB_0086a9ec;
        }
        pcVar3 = "(1 << 10) == diy_fp.f() - boundary_minus.f()";
        uVar5 = 0x119;
      }
      else {
        pcVar3 = "diy_fp.f() - boundary_minus.f() == boundary_plus.f() - diy_fp.f()";
        uVar5 = 0x118;
      }
LAB_0086aa31:
      printf("%s:%d:\n CHECK(%s) failed\n",
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-ieee.cc"
             ,uVar5,pcVar3);
      abort();
    }
    pcVar3 = "boundary_plus.e()";
    uVar5 = 0x115;
    uVar8 = local_50.e_;
  }
  else {
    pcVar3 = "boundary_minus.e()";
    uVar5 = 0x114;
    uVar8 = local_40.e_;
  }
LAB_0086a9ec:
  printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %d\n#  Found:    %d\n",
         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-ieee.cc"
         ,uVar5,"diy_fp.e()",pcVar3,(ulong)uVar4,uVar8);
  abort();
}

Assistant:

TEST(Double_NormalizedBoundaries) {
  DiyFp boundary_plus;
  DiyFp boundary_minus;
  DiyFp diy_fp = Double(1.5).AsNormalizedDiyFp();
  Double(1.5).NormalizedBoundaries(&boundary_minus, &boundary_plus);
  CHECK_EQ(diy_fp.e(), boundary_minus.e());
  CHECK_EQ(diy_fp.e(), boundary_plus.e());
  // 1.5 does not have a significand of the form 2^p (for some p).
  // Therefore its boundaries are at the same distance.
  CHECK(diy_fp.f() - boundary_minus.f() == boundary_plus.f() - diy_fp.f());
  CHECK((1 << 10) == diy_fp.f() - boundary_minus.f());  // NOLINT

  diy_fp = Double(1.0).AsNormalizedDiyFp();
  Double(1.0).NormalizedBoundaries(&boundary_minus, &boundary_plus);
  CHECK_EQ(diy_fp.e(), boundary_minus.e());
  CHECK_EQ(diy_fp.e(), boundary_plus.e());
  // 1.0 does have a significand of the form 2^p (for some p).
  // Therefore its lower boundary is twice as close as the upper boundary.
  CHECK(boundary_plus.f() - diy_fp.f() > diy_fp.f() - boundary_minus.f());
  CHECK((1 << 9) == diy_fp.f() - boundary_minus.f());  // NOLINT
  CHECK((1 << 10) == boundary_plus.f() - diy_fp.f());  // NOLINT

  uint64_t min_double64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x00000000, 00000001);
  diy_fp = Double(min_double64).AsNormalizedDiyFp();
  Double(min_double64).NormalizedBoundaries(&boundary_minus, &boundary_plus);
  CHECK_EQ(diy_fp.e(), boundary_minus.e());
  CHECK_EQ(diy_fp.e(), boundary_plus.e());
  // min-value does not have a significand of the form 2^p (for some p).
  // Therefore its boundaries are at the same distance.
  CHECK(diy_fp.f() - boundary_minus.f() == boundary_plus.f() - diy_fp.f());
  // Denormals have their boundaries much closer.
  CHECK((static_cast<uint64_t>(1) << 62) ==
        diy_fp.f() - boundary_minus.f());  // NOLINT

  uint64_t smallest_normal64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x00100000, 00000000);
  diy_fp = Double(smallest_normal64).AsNormalizedDiyFp();
  Double(smallest_normal64).NormalizedBoundaries(&boundary_minus,
                                                 &boundary_plus);
  CHECK_EQ(diy_fp.e(), boundary_minus.e());
  CHECK_EQ(diy_fp.e(), boundary_plus.e());
  // Even though the significand is of the form 2^p (for some p), its boundaries
  // are at the same distance. (This is the only exception).
  CHECK(diy_fp.f() - boundary_minus.f() == boundary_plus.f() - diy_fp.f());
  CHECK((1 << 10) == diy_fp.f() - boundary_minus.f());  // NOLINT

  uint64_t largest_denormal64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x000FFFFF, FFFFFFFF);
  diy_fp = Double(largest_denormal64).AsNormalizedDiyFp();
  Double(largest_denormal64).NormalizedBoundaries(&boundary_minus,
                                                  &boundary_plus);
  CHECK_EQ(diy_fp.e(), boundary_minus.e());
  CHECK_EQ(diy_fp.e(), boundary_plus.e());
  CHECK(diy_fp.f() - boundary_minus.f() == boundary_plus.f() - diy_fp.f());
  CHECK((1 << 11) == diy_fp.f() - boundary_minus.f());  // NOLINT

  uint64_t max_double64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x7fefffff, ffffffff);
  diy_fp = Double(max_double64).AsNormalizedDiyFp();
  Double(max_double64).NormalizedBoundaries(&boundary_minus, &boundary_plus);
  CHECK_EQ(diy_fp.e(), boundary_minus.e());
  CHECK_EQ(diy_fp.e(), boundary_plus.e());
  // max-value does not have a significand of the form 2^p (for some p).
  // Therefore its boundaries are at the same distance.
  CHECK(diy_fp.f() - boundary_minus.f() == boundary_plus.f() - diy_fp.f());
  CHECK((1 << 10) == diy_fp.f() - boundary_minus.f());  // NOLINT
}